

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O3

uint16_t addip_u16n(uint16_t *a,uint16_t *b,size_t na,size_t nb)

{
  ushort uVar1;
  long lVar2;
  uint uVar3;
  size_t ib;
  size_t ia;
  long lVar4;
  uint uVar5;
  bool bVar6;
  
  uVar3 = 0;
  if (nb != 0) {
    lVar4 = na - 1;
    do {
      if (lVar4 == -1) {
        __assert_fail("ia",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-util.c"
                      ,0x486,"uint16_t addip_u16n(uint16_t *, const uint16_t *, size_t, size_t)");
      }
      lVar2 = nb - 1;
      nb = nb - 1;
      uVar5 = (uint)b[lVar2] + uVar3 + a[lVar4];
      a[lVar4] = (uint16_t)uVar5;
      uVar3 = uVar5 >> 0x10;
      lVar4 = lVar4 + -1;
    } while (nb != 0);
    if ((lVar4 != -1) && (0xffff < uVar5)) {
      do {
        uVar1 = a[lVar4];
        uVar3 = uVar1 + 1;
        a[lVar4] = (uint16_t)uVar3;
        bVar6 = lVar4 == 0;
        lVar4 = lVar4 + -1;
        if (bVar6) break;
      } while (uVar1 == 0xffff);
      uVar3 = uVar3 >> 0x10;
    }
  }
  return (uint16_t)uVar3;
}

Assistant:

static uint16_t addip_u16n(uint16_t *a, const uint16_t *b, size_t na, size_t nb)
{
	const uint32_t mask = ((uint32_t)1 << 16) - 1;
	uint16_t carry = 0;
	size_t ia = na, ib = nb;

	while (ib > 0) {
		uint32_t t;

		assert(ia);
		--ia;
		--ib;
		t = (uint32_t)a[ia] + (uint32_t)b[ib] + (uint32_t)carry;
		a[ia] = t & mask;
		carry = (uint16_t)(t >> 16);
	}
	while (ia > 0 && carry) {
		uint32_t t;

		--ia;
		t = (uint32_t)a[ia] + (uint32_t)carry;
		a[ia] = t & mask;
		carry = (uint16_t)(t >> 16);
	}
	return carry;
}